

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_crt_check_san_uri(mbedtls_x509_sequence *san,char *cn,size_t cn_len)

{
  int iVar1;
  mbedtls_asn1_sequence *pmStack_30;
  uchar san_type;
  mbedtls_x509_sequence *cur;
  size_t cn_len_local;
  char *cn_local;
  mbedtls_x509_sequence *san_local;
  
  pmStack_30 = san;
  while( true ) {
    if (pmStack_30 == (mbedtls_x509_sequence *)0x0) {
      return -1;
    }
    if (((((byte)(pmStack_30->buf).tag & 0x1f) == 6) && ((pmStack_30->buf).len == cn_len)) &&
       (iVar1 = memcmp((pmStack_30->buf).p,cn,cn_len), iVar1 == 0)) break;
    pmStack_30 = pmStack_30->next;
  }
  return 0;
}

Assistant:

static int x509_crt_check_san_uri(const mbedtls_x509_sequence *san,
                                  const char *cn, size_t cn_len)
{
    for (const mbedtls_x509_sequence *cur = san; cur != NULL; cur = cur->next) {
        const unsigned char san_type = (unsigned char) cur->buf.tag &
                                       MBEDTLS_ASN1_TAG_VALUE_MASK;
        if (san_type == MBEDTLS_X509_SAN_UNIFORM_RESOURCE_IDENTIFIER &&
            cur->buf.len == cn_len && memcmp(cur->buf.p, cn, cn_len) == 0) {
            return 0;
        }
    }

    return -1;
}